

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool __thiscall
pugi::xml_document::save_file
          (xml_document *this,wchar_t *path_,char_t *indent,uint flags,xml_encoding encoding)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  wchar_t *mode;
  
  mode = L"w";
  if ((flags & 0x20) == 0) {
    mode = L"wb";
  }
  __stream = (FILE *)impl::anon_unknown_0::open_file_wide(path_,mode);
  bVar1 = impl::anon_unknown_0::save_file_impl(this,(FILE *)__stream,indent,flags,encoding);
  if (bVar1) {
    iVar2 = fclose(__stream);
    bVar1 = iVar2 == 0;
    __stream = (FILE *)0x0;
  }
  else {
    bVar1 = false;
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return bVar1;
}

Assistant:

PUGI__FN bool xml_document::save_file(const wchar_t* path_, const char_t* indent, unsigned int flags, xml_encoding encoding) const
	{
		using impl::auto_deleter; // MSVC7 workaround
		auto_deleter<FILE> file(impl::open_file_wide(path_, (flags & format_save_file_text) ? L"w" : L"wb"), impl::close_file);

		return impl::save_file_impl(*this, file.data, indent, flags, encoding) && fclose(file.release()) == 0;
	}